

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall
xmrig::Network::onResultAccepted
          (Network *this,IStrategy *param_2,IClient *param_3,SubmitResult *result,char *error)

{
  char *pcVar1;
  long in_RCX;
  long in_RDI;
  long in_R8;
  char *unaff_retaddr;
  SubmitResult *in_stack_00000008;
  NetworkState *in_stack_00000010;
  undefined8 in_stack_ffffffffffffffb8;
  uint32_t backend;
  
  backend = (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  NetworkState::add(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (in_R8 == 0) {
    pcVar1 = backend_tag(backend);
    Log::print(INFO,
               "%s \x1b[1;32maccepted\x1b[0m (%ld/%ld) diff \x1b[1;37m%lu\x1b[0m \x1b[1;30m(%lu ms)\x1b[0m"
               ,pcVar1,*(undefined8 *)(in_RDI + 400),*(undefined8 *)(in_RDI + 0x1a8),
               *(undefined8 *)(in_RCX + 0x20),*(undefined8 *)(in_RCX + 0x28));
  }
  else {
    pcVar1 = backend_tag(backend);
    Log::print(INFO,
               "%s \x1b[1;31mrejected\x1b[0m (%ld/%ld) diff \x1b[1;37m%lu\x1b[0m \x1b[0;31m\"%s\"\x1b[0m \x1b[1;30m(%lu ms)\x1b[0m"
               ,pcVar1,*(undefined8 *)(in_RDI + 400),*(undefined8 *)(in_RDI + 0x1a8),
               *(undefined8 *)(in_RCX + 0x20),in_R8,*(undefined8 *)(in_RCX + 0x28));
  }
  return;
}

Assistant:

void xmrig::Network::onResultAccepted(IStrategy *, IClient *, const SubmitResult &result, const char *error)
{
    m_state.add(result, error);

    if (error) {
        LOG_INFO("%s " RED_BOLD("rejected") " (%" PRId64 "/%" PRId64 ") diff " WHITE_BOLD("%" PRIu64) " " RED("\"%s\"") " " BLACK_BOLD("(%" PRIu64 " ms)"),
                 backend_tag(result.backend), m_state.accepted, m_state.rejected, result.diff, error, result.elapsed);
    }
    else {
        LOG_INFO("%s " GREEN_BOLD("accepted") " (%" PRId64 "/%" PRId64 ") diff " WHITE_BOLD("%" PRIu64) " " BLACK_BOLD("(%" PRIu64 " ms)"),
                 backend_tag(result.backend), m_state.accepted, m_state.rejected, result.diff, result.elapsed);
    }
}